

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::AppendLiteral
          (MatchLiteralNode *this,CharCount *litbufNext,CharCount litbufLen,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Char *litbuf_local;
  CharCount litbufLen_local;
  CharCount *litbufNext_local;
  MatchLiteralNode *this_local;
  
  if ((this->isEquivClass & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x323,"(!isEquivClass)","!isEquivClass");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((litbufLen < *litbufNext + this->length) || (litbufLen < this->offset + this->length)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x324,"(litbufNext + length <= litbufLen && offset + length <= litbufLen)",
                       "litbufNext + length <= litbufLen && offset + length <= litbufLen");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*litbufNext + this->length <= litbufLen) && (this->offset + this->length <= litbufLen)) {
    js_wmemcpy_s(litbuf + *litbufNext,(ulong)(litbufLen - *litbufNext),litbuf + this->offset,
                 (ulong)this->length);
  }
  *litbufNext = this->length + *litbufNext;
  return;
}

Assistant:

void MatchLiteralNode::AppendLiteral(CharCount& litbufNext, CharCount litbufLen, __inout_ecount(litbufLen) Char* litbuf) const
    {
        // Called during parsing only, so literal always in original form
        Assert(!isEquivClass);
        Assert(litbufNext + length <= litbufLen && offset + length <= litbufLen);
#pragma prefast(suppress:26000, "The error said that offset + length >= litbufLen + 1, which is incorrect due to if statement below.")
        if (litbufNext + length <= litbufLen && offset + length <= litbufLen) // for prefast
        {
            js_wmemcpy_s(litbuf + litbufNext, litbufLen - litbufNext, litbuf + offset, length);
        }
        litbufNext += length;
    }